

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keyword_validator.hpp
# Opt level: O0

void __thiscall
jsoncons::jsonschema::
maximum_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::maximum_validator(maximum_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *this,basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *schema,uri *schema_location,string *custom_message,
                   basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *value
                   )

{
  uri *in_RDI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff38;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_ffffffffffffff40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  string *in_stack_ffffffffffffff48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *schema_00;
  string *in_stack_ffffffffffffff60;
  void **in_stack_ffffffffffffff68;
  allocator<char> *in_stack_ffffffffffffff70;
  char *in_stack_ffffffffffffff78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff80;
  undefined1 local_49 [73];
  
  validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::validator_base((validator_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                    *)&in_RDI[1].fragment_part_);
  schema_00 = (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)local_49
  ;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  ::keyword_validator((keyword_validator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
                       *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,
                      in_stack_ffffffffffffff60,schema_00,in_RDI,in_stack_ffffffffffffff48);
  std::__cxx11::string::~string((string *)(local_49 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_49);
  *(undefined8 *)&in_RDI->uri_string_ = 0x1342938;
  in_RDI[1].fragment_part_.first = 0x13429c0;
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI[1].port_part_
  ;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI[1].path_part_
  ;
  basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::as<std::__cxx11::string>
            ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)__lhs);
  std::operator+((char *)__lhs,__rhs);
  std::operator+(__lhs,(char *)__rhs);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff60);
  return;
}

Assistant:

maximum_validator(const Json& schema, const uri& schema_location, const std::string& custom_message, const Json& value)
            : keyword_validator<Json>("maximum", schema, schema_location, custom_message), value_(value),
              message_{"Maximum value is " + value.template as<std::string>() + " but found"}
        {
        }